

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smyblas2.c
# Opt level: O0

void slsolve(int ldm,int ncol,float *M,float *rhs)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float local_94;
  float *pfStack_90;
  int firstcol;
  float *Mki7;
  float *Mki6;
  float *Mki5;
  float *Mki4;
  float *Mki3;
  float *Mki2;
  float *Mki1;
  float *Mki0;
  float *M0;
  float x7;
  float x6;
  float x5;
  float x4;
  float x3;
  float x2;
  float x1;
  float x0;
  int k;
  float *rhs_local;
  float *M_local;
  int ncol_local;
  int ldm_local;
  
  local_94 = 0.0;
  Mki0 = M;
  while ((int)local_94 < ncol + -7) {
    pfVar2 = Mki0 + 1;
    pfVar3 = pfVar2 + (long)ldm + 1;
    pfVar4 = pfVar3 + (long)ldm + 1;
    pfVar5 = pfVar4 + (long)ldm + 1;
    pfVar6 = pfVar5 + (long)ldm + 1;
    pfVar7 = pfVar6 + (long)ldm + 1;
    pfStack_90 = pfVar7 + (long)ldm + 1 + ldm;
    fVar1 = rhs[(int)local_94];
    fVar8 = -fVar1 * *pfVar2 + rhs[(int)local_94 + 1];
    fVar9 = -fVar8 * *pfVar3 + -fVar1 * Mki0[2] + rhs[(int)local_94 + 2];
    fVar10 = -fVar9 * *pfVar4 +
             -fVar8 * pfVar2[(long)ldm + 2] + -fVar1 * Mki0[3] + rhs[(int)local_94 + 3];
    fVar11 = -fVar10 * *pfVar5 +
             -fVar9 * pfVar3[(long)ldm + 2] +
             -fVar8 * pfVar2[(long)ldm + 3] + -fVar1 * Mki0[4] + rhs[(int)local_94 + 4];
    fVar12 = -fVar11 * *pfVar6 +
             -fVar10 * pfVar4[(long)ldm + 2] +
             -fVar9 * pfVar3[(long)ldm + 3] +
             -fVar8 * pfVar2[(long)ldm + 4] + -fVar1 * Mki0[5] + rhs[(int)local_94 + 5];
    fVar13 = -fVar12 * *pfVar7 +
             -fVar11 * pfVar5[(long)ldm + 2] +
             -fVar10 * pfVar4[(long)ldm + 3] +
             -fVar9 * pfVar3[(long)ldm + 4] +
             -fVar8 * pfVar2[(long)ldm + 5] + -fVar1 * Mki0[6] + rhs[(int)local_94 + 6];
    fVar14 = -fVar13 * pfVar7[(long)ldm + 1] +
             -fVar12 * pfVar6[(long)ldm + 2] +
             -fVar11 * pfVar5[(long)ldm + 3] +
             -fVar10 * pfVar4[(long)ldm + 4] +
             -fVar9 * pfVar3[(long)ldm + 5] +
             -fVar8 * pfVar2[(long)ldm + 6] + -fVar1 * Mki0[7] + rhs[(int)local_94 + 7];
    rhs[(int)local_94 + 1] = fVar8;
    rhs[(int)local_94 + 2] = fVar9;
    rhs[(int)local_94 + 3] = fVar10;
    rhs[(int)local_94 + 4] = fVar11;
    rhs[(int)local_94 + 5] = fVar12;
    rhs[(int)local_94 + 6] = fVar13;
    rhs[(int)local_94 + 7] = fVar14;
    local_94 = (float)((int)local_94 + 8);
    Mki7 = pfVar7 + (long)ldm + 2;
    Mki6 = pfVar6 + (long)ldm + 3;
    Mki5 = pfVar5 + (long)ldm + 4;
    Mki4 = pfVar4 + (long)ldm + 5;
    Mki3 = pfVar3 + (long)ldm + 6;
    Mki2 = pfVar2 + (long)ldm + 7;
    Mki1 = Mki0 + 8;
    for (x1 = local_94; pfStack_90 = pfStack_90 + 1, (int)x1 < ncol; x1 = (float)((int)x1 + 1)) {
      rhs[(int)x1] = -fVar14 * *pfStack_90 +
                     -fVar13 * *Mki7 +
                     -fVar12 * *Mki6 +
                     -fVar11 * *Mki5 +
                     -fVar10 * *Mki4 +
                     -fVar9 * *Mki3 + -fVar8 * *Mki2 + -fVar1 * *Mki1 + rhs[(int)x1];
      Mki7 = Mki7 + 1;
      Mki6 = Mki6 + 1;
      Mki5 = Mki5 + 1;
      Mki4 = Mki4 + 1;
      Mki3 = Mki3 + 1;
      Mki2 = Mki2 + 1;
      Mki1 = Mki1 + 1;
    }
    Mki0 = Mki0 + (ldm * 8 + 8);
  }
  while ((int)local_94 < ncol + -3) {
    pfVar2 = Mki0 + 1;
    pfVar3 = pfVar2 + (long)ldm + 1;
    Mki4 = pfVar3 + (long)ldm + 1 + ldm;
    fVar1 = rhs[(int)local_94];
    fVar8 = -fVar1 * *pfVar2 + rhs[(int)local_94 + 1];
    fVar9 = -fVar8 * *pfVar3 + -fVar1 * Mki0[2] + rhs[(int)local_94 + 2];
    fVar10 = -fVar9 * pfVar3[(long)ldm + 1] +
             -fVar8 * pfVar2[(long)ldm + 2] + -fVar1 * Mki0[3] + rhs[(int)local_94 + 3];
    rhs[(int)local_94 + 1] = fVar8;
    rhs[(int)local_94 + 2] = fVar9;
    rhs[(int)local_94 + 3] = fVar10;
    local_94 = (float)((int)local_94 + 4);
    Mki3 = pfVar3 + (long)ldm + 2;
    Mki2 = pfVar2 + (long)ldm + 3;
    Mki1 = Mki0 + 4;
    for (x1 = local_94; Mki4 = Mki4 + 1, (int)x1 < ncol; x1 = (float)((int)x1 + 1)) {
      rhs[(int)x1] = -fVar10 * *Mki4 +
                     -fVar9 * *Mki3 + -fVar8 * *Mki2 + -fVar1 * *Mki1 + rhs[(int)x1];
      Mki3 = Mki3 + 1;
      Mki2 = Mki2 + 1;
      Mki1 = Mki1 + 1;
    }
    Mki0 = Mki0 + (ldm * 4 + 4);
  }
  if ((int)local_94 < ncol + -1) {
    Mki2 = Mki0 + 1 + ldm;
    fVar1 = rhs[(int)local_94];
    fVar8 = -fVar1 * Mki0[1] + rhs[(int)local_94 + 1];
    rhs[(int)local_94 + 1] = fVar8;
    Mki1 = Mki0 + 2;
    for (x1 = (float)((int)local_94 + 2); Mki2 = Mki2 + 1, (int)x1 < ncol; x1 = (float)((int)x1 + 1)
        ) {
      rhs[(int)x1] = -fVar8 * *Mki2 + -fVar1 * *Mki1 + rhs[(int)x1];
      Mki1 = Mki1 + 1;
    }
  }
  return;
}

Assistant:

void slsolve ( int ldm, int ncol, float *M, float *rhs )
{
    int k;
    float x0, x1, x2, x3, x4, x5, x6, x7;
    float *M0;
    register float *Mki0, *Mki1, *Mki2, *Mki3, *Mki4, *Mki5, *Mki6, *Mki7;
    register int firstcol = 0;

    M0 = &M[0];

    while ( firstcol < ncol - 7 ) { /* Do 8 columns */
      Mki0 = M0 + 1;
      Mki1 = Mki0 + ldm + 1;
      Mki2 = Mki1 + ldm + 1;
      Mki3 = Mki2 + ldm + 1;
      Mki4 = Mki3 + ldm + 1;
      Mki5 = Mki4 + ldm + 1;
      Mki6 = Mki5 + ldm + 1;
      Mki7 = Mki6 + ldm + 1;

      x0 = rhs[firstcol];
      x1 = rhs[firstcol+1] - x0 * *Mki0++;
      x2 = rhs[firstcol+2] - x0 * *Mki0++ - x1 * *Mki1++;
      x3 = rhs[firstcol+3] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++;
      x4 = rhs[firstcol+4] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++
	                   - x3 * *Mki3++;
      x5 = rhs[firstcol+5] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++
	                   - x3 * *Mki3++ - x4 * *Mki4++;
      x6 = rhs[firstcol+6] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++
	                   - x3 * *Mki3++ - x4 * *Mki4++ - x5 * *Mki5++;
      x7 = rhs[firstcol+7] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++
	                   - x3 * *Mki3++ - x4 * *Mki4++ - x5 * *Mki5++
			   - x6 * *Mki6++;

      rhs[++firstcol] = x1;
      rhs[++firstcol] = x2;
      rhs[++firstcol] = x3;
      rhs[++firstcol] = x4;
      rhs[++firstcol] = x5;
      rhs[++firstcol] = x6;
      rhs[++firstcol] = x7;
      ++firstcol;
    
      for (k = firstcol; k < ncol; k++)
	rhs[k] = rhs[k] - x0 * *Mki0++ - x1 * *Mki1++
	                - x2 * *Mki2++ - x3 * *Mki3++
                        - x4 * *Mki4++ - x5 * *Mki5++
			- x6 * *Mki6++ - x7 * *Mki7++;
 
      M0 += 8 * ldm + 8;
    }

    while ( firstcol < ncol - 3 ) { /* Do 4 columns */
      Mki0 = M0 + 1;
      Mki1 = Mki0 + ldm + 1;
      Mki2 = Mki1 + ldm + 1;
      Mki3 = Mki2 + ldm + 1;

      x0 = rhs[firstcol];
      x1 = rhs[firstcol+1] - x0 * *Mki0++;
      x2 = rhs[firstcol+2] - x0 * *Mki0++ - x1 * *Mki1++;
      x3 = rhs[firstcol+3] - x0 * *Mki0++ - x1 * *Mki1++ - x2 * *Mki2++;

      rhs[++firstcol] = x1;
      rhs[++firstcol] = x2;
      rhs[++firstcol] = x3;
      ++firstcol;
    
      for (k = firstcol; k < ncol; k++)
	rhs[k] = rhs[k] - x0 * *Mki0++ - x1 * *Mki1++
	                - x2 * *Mki2++ - x3 * *Mki3++;
 
      M0 += 4 * ldm + 4;
    }

    if ( firstcol < ncol - 1 ) { /* Do 2 columns */
      Mki0 = M0 + 1;
      Mki1 = Mki0 + ldm + 1;

      x0 = rhs[firstcol];
      x1 = rhs[firstcol+1] - x0 * *Mki0++;

      rhs[++firstcol] = x1;
      ++firstcol;
    
      for (k = firstcol; k < ncol; k++)
	rhs[k] = rhs[k] - x0 * *Mki0++ - x1 * *Mki1++;
 
    }
    
}